

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Attach_File(FT_Face face,char *filepathname)

{
  FT_Error FVar1;
  undefined1 local_48 [8];
  FT_Open_Args open;
  
  if (filepathname != (char *)0x0) {
    open.pathname = (FT_String *)0x0;
    local_48._0_4_ = 4;
    open.memory_size = (FT_Long)filepathname;
    FVar1 = FT_Attach_Stream(face,(FT_Open_Args *)local_48);
    return FVar1;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Attach_File( FT_Face      face,
                  const char*  filepathname )
  {
    FT_Open_Args  open;


    /* test for valid `face' delayed to `FT_Attach_Stream' */

    if ( !filepathname )
      return FT_THROW( Invalid_Argument );

    open.stream   = NULL;
    open.flags    = FT_OPEN_PATHNAME;
    open.pathname = (char*)filepathname;

    return FT_Attach_Stream( face, &open );
  }